

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest_isb_absx_no_carry_or_overflow_no_pagecrossing_Test
::~CpuAbsoluteIndexedTest_isb_absx_no_carry_or_overflow_no_pagecrossing_Test
          (CpuAbsoluteIndexedTest_isb_absx_no_carry_or_overflow_no_pagecrossing_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, isb_absx_no_carry_or_overflow_no_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG | C_FLAG;
    expected.p = N_FLAG;
    expected.a = 0xE0;
    memory_content = 0xF0 - 0x01;

    run_readwrite_instruction_without_pagecrossing(ISB_ABSX, IndexReg::X, 0xF0);
}